

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::handleExpr
          (RunContext *this,AssertionInfo *info,ITransientExpression *expr,
          AssertionReaction *reaction)

{
  bool negated_00;
  bool bVar1;
  pointer pIVar2;
  bool result;
  bool negated;
  AssertionReaction *reaction_local;
  ITransientExpression *expr_local;
  AssertionInfo *info_local;
  RunContext *this_local;
  
  pIVar2 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->(&this->m_reporter);
  (*pIVar2->_vptr_IStreamingReporter[0xd])(pIVar2,info);
  negated_00 = isFalseTest(info->resultDisposition);
  bVar1 = ITransientExpression::getResult(expr);
  if (bVar1 == negated_00) {
    reportExpr(this,info,ExpressionFailed,expr,negated_00);
    populateReaction(this,reaction);
  }
  else if ((this->m_includeSuccessfulResults & 1U) == 0) {
    (*(this->super_IResultCapture)._vptr_IResultCapture[0x15])();
  }
  else {
    reportExpr(this,info,Ok,expr,negated_00);
  }
  return;
}

Assistant:

void RunContext::handleExpr(
        AssertionInfo const& info,
        ITransientExpression const& expr,
        AssertionReaction& reaction
    ) {
        m_reporter->assertionStarting( info );

        bool negated = isFalseTest( info.resultDisposition );
        bool result = expr.getResult() != negated;

        if( result ) {
            if (!m_includeSuccessfulResults) {
                assertionPassed();
            }
            else {
                reportExpr(info, ResultWas::Ok, &expr, negated);
            }
        }
        else {
            reportExpr(info, ResultWas::ExpressionFailed, &expr, negated );
            populateReaction( reaction );
        }
    }